

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometrycollection.cpp
# Opt level: O2

void instantiateGeometry(Json *conf)

{
  bool bVar1;
  const_reference this;
  reference other;
  reference pvVar2;
  mapped_type *ppPVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  vector<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>,_std::allocator<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>_>_>
  v;
  const_iterator __end1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  o;
  TaskScheduler tasks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b0;
  TaskScheduler local_a0;
  
  this = nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     *)conf,"primitives");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cbegin((const_iterator *)&local_a0,this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend((const_iterator *)&local_d0,this);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_a0,
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_d0);
    if (!bVar1) break;
    other = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&local_a0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&local_b0,other);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_b0,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"mesh");
    if (bVar1) {
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_b0,"file");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8,pvVar2);
      ppPVar3 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)(anonymous_namespace)::meshref_abi_cxx11_,&local_f8);
      *ppPVar3 = (mapped_type)0x0;
      std::__cxx11::string::~string((string *)&local_f8);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_b0);
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *)&local_a0);
  }
  local_f8.field_2._M_allocated_capacity = 0;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  local_a0.tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)((anonymous_namespace)::meshref_abi_cxx11_ + 0x10);
  while (local_a0.tasks.c.
         super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
         .super__Deque_impl_data._M_map =
              (_Map_pointer)
              *local_a0.tasks.c.
               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Deque_impl_data._M_map,
        (function<void_()> *)
        local_a0.tasks.c.
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_map != (function<void_()> *)0x0) {
    std::
    vector<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>,_std::allocator<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>_>_>
    ::push_back((vector<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>,_std::allocator<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>_>_>
                 *)&local_f8,(value_type *)&local_a0);
  }
  TaskScheduler::TaskScheduler(&local_a0);
  _Var5._M_p = local_f8._M_dataplus._M_p;
  for (_Var4._M_p = local_f8._M_dataplus._M_p; _Var4._M_p != (pointer)local_f8._M_string_length;
      _Var4._M_p = _Var4._M_p + 8) {
    local_d0._8_8_ = 0;
    local_b8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/geometry/geometrycollection.cpp:38:13)>
               ::_M_invoke;
    local_c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]toyray/src/geometry/geometrycollection.cpp:38:13)>
               ::_M_manager;
    local_d0._M_unused._0_8_ = (undefined8)_Var5._M_p;
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&local_a0,
               (value_type *)&local_d0);
    std::_Function_base::~_Function_base((_Function_base *)&local_d0);
    _Var5._M_p = _Var5._M_p + 8;
  }
  TaskScheduler::start(&local_a0);
  TaskScheduler::~TaskScheduler(&local_a0);
  std::
  _Vector_base<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>,_std::allocator<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>_>_>
  ::~_Vector_base((_Vector_base<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>,_std::allocator<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>,_false,_true>_>_>
                   *)&local_f8);
  return;
}

Assistant:

void instantiateGeometry(const Json& conf)
{
	// auto instancing for meshes
	for (auto o: conf["primitives"])
	{
		if (o["type"] == "mesh") {
			meshref[o["file"]] = NULL;
		}
	}
	// flatten map elements for parallelization
	std::vector<std::unordered_map<std::string, Primitive*>::iterator> v;
	for (auto it = meshref.begin(); it != meshref.end(); ++it)
		v.push_back(it);

	// start instantiation
	TaskScheduler tasks;
	for (auto p = v.begin(); p != v.end(); ++p)
		tasks.add([p](){
			(*p)->second = new TriangleMesh((*p)->first);
		});
	tasks.start();
}